

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall
capnp::_::BuilderArena::BuilderArena
          (BuilderArena *this,MessageBuilder *message,
          ArrayPtr<capnp::MessageBuilder::SegmentInit> segments)

{
  int value;
  SegmentWordCount size;
  SegmentWordCount wordsUsed;
  SegmentInit *pSVar1;
  word *ptr;
  size_t sVar2;
  Own<capnp::_::SegmentBuilder> *this_00;
  SegmentBuilder *pSVar3;
  Vector<kj::Own<capnp::_::SegmentBuilder>_> *pVVar4;
  Vector<kj::ArrayPtr<const_capnp::word>_> *pVVar5;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> AVar6;
  MultiSegmentState local_150;
  Own<capnp::_::BuilderArena::MultiSegmentState> local_110;
  Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState>_> local_100;
  undefined1 local_f0 [8];
  Vector<kj::ArrayPtr<const_capnp::word>_> forOutput;
  ReadLimiter *local_c8;
  SegmentWordCount local_bc;
  word *local_b8;
  Id<unsigned_int,_capnp::_::Segment> local_ac;
  BuilderArena *local_a8;
  Own<capnp::_::SegmentBuilder> local_a0;
  SegmentInit *local_90;
  SegmentInit *segment;
  SegmentInit *__end3;
  SegmentInit *__begin3;
  size_t local_70;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> *local_68;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> *__range3;
  undefined1 local_58 [4];
  uint i;
  Vector<kj::Own<capnp::_::SegmentBuilder>_> builders;
  MessageBuilder *message_local;
  BuilderArena *this_local;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> segments_local;
  
  segments_local.ptr = (SegmentInit *)segments.size_;
  this_local = (BuilderArena *)segments.ptr;
  Arena::Arena(&this->super_Arena);
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__BuilderArena_003a7188;
  this->message = message;
  ReadLimiter::ReadLimiter(&this->dummyLimiter);
  LocalCapTable::LocalCapTable(&this->localCapTable);
  kj::Id<unsigned_int,_capnp::_::Segment>::Id
            ((Id<unsigned_int,_capnp::_::Segment> *)&builders.builder.disposer,0);
  pSVar1 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::operator[]
                     ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local,0);
  ptr = kj::ArrayPtr<capnp::word>::begin(&pSVar1->space);
  pSVar1 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::operator[]
                     ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local,0);
  sVar2 = kj::ArrayPtr<capnp::word>::size(&pSVar1->space);
  size = verifySegmentSize(sVar2);
  pSVar1 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::operator[]
                     ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local,0);
  wordsUsed = verifySegmentSize(pSVar1->wordsUsed);
  SegmentBuilder::SegmentBuilder
            (&this->segment0,this,builders.builder.disposer._0_4_,ptr,size,&this->dummyLimiter,
             wordsUsed);
  kj::ArrayPtr<const_capnp::word>::ArrayPtr(&this->segment0ForOutput);
  kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState>_>::Maybe(&this->moreSegments);
  this->segmentWithSpace = (SegmentBuilder *)0x0;
  sVar2 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::size
                    ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local);
  if (sVar2 < 2) {
    this->segmentWithSpace = &this->segment0;
  }
  else {
    sVar2 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::size
                      ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local);
    kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::Vector
              ((Vector<kj::Own<capnp::_::SegmentBuilder>_> *)local_58,sVar2 - 1);
    __range3._4_4_ = 1;
    sVar2 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::size
                      ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local);
    AVar6 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::slice
                      ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local,1,sVar2);
    local_70 = AVar6.size_;
    __begin3 = AVar6.ptr;
    local_68 = (ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&__begin3;
    __end3 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::begin(local_68);
    segment = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::end(local_68);
    for (; value = __range3._4_4_, __end3 != segment; __end3 = __end3 + 1) {
      local_90 = __end3;
      __range3._4_4_ = __range3._4_4_ + 1;
      local_a8 = this;
      kj::Id<unsigned_int,_capnp::_::Segment>::Id(&local_ac,value);
      local_b8 = kj::ArrayPtr<capnp::word>::begin(&local_90->space);
      sVar2 = kj::ArrayPtr<capnp::word>::size(&local_90->space);
      local_bc = verifySegmentSize(sVar2);
      local_c8 = &this->dummyLimiter;
      forOutput.builder.disposer._4_4_ = verifySegmentSize(local_90->wordsUsed);
      kj::
      heap<capnp::_::SegmentBuilder,capnp::_::BuilderArena*,kj::Id<unsigned_int,capnp::_::Segment>,capnp::word*,unsigned_int,capnp::_::ReadLimiter*,unsigned_int>
                ((kj *)&local_a0,&local_a8,&local_ac,&local_b8,&local_bc,&local_c8,
                 (uint *)((long)&forOutput.builder.disposer + 4));
      kj::Vector<kj::Own<capnp::_::SegmentBuilder>>::add<kj::Own<capnp::_::SegmentBuilder>>
                ((Vector<kj::Own<capnp::_::SegmentBuilder>> *)local_58,&local_a0);
      kj::Own<capnp::_::SegmentBuilder>::~Own(&local_a0);
    }
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::Vector
              ((Vector<kj::ArrayPtr<const_capnp::word>_> *)local_f0);
    sVar2 = kj::ArrayPtr<capnp::MessageBuilder::SegmentInit>::size
                      ((ArrayPtr<capnp::MessageBuilder::SegmentInit> *)&this_local);
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::resize
              ((Vector<kj::ArrayPtr<const_capnp::word>_> *)local_f0,sVar2);
    this_00 = kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::back
                        ((Vector<kj::Own<capnp::_::SegmentBuilder>_> *)local_58);
    pSVar3 = kj::Own::operator_cast_to_SegmentBuilder_((Own *)this_00);
    this->segmentWithSpace = pSVar3;
    pVVar4 = kj::mv<kj::Vector<kj::Own<capnp::_::SegmentBuilder>>>
                       ((Vector<kj::Own<capnp::_::SegmentBuilder>_> *)local_58);
    kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::Vector(&local_150.builders,pVVar4);
    pVVar5 = kj::mv<kj::Vector<kj::ArrayPtr<capnp::word_const>>>
                       ((Vector<kj::ArrayPtr<const_capnp::word>_> *)local_f0);
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::Vector(&local_150.forOutput,pVVar5);
    kj::heap<capnp::_::BuilderArena::MultiSegmentState>((kj *)&local_110,&local_150);
    kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState>_>::Maybe(&local_100,&local_110);
    kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState>_>::operator=
              (&this->moreSegments,&local_100);
    kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState>_>::~Maybe(&local_100);
    kj::Own<capnp::_::BuilderArena::MultiSegmentState>::~Own(&local_110);
    MultiSegmentState::~MultiSegmentState(&local_150);
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::~Vector
              ((Vector<kj::ArrayPtr<const_capnp::word>_> *)local_f0);
    kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::~Vector
              ((Vector<kj::Own<capnp::_::SegmentBuilder>_> *)local_58);
  }
  return;
}

Assistant:

BuilderArena::BuilderArena(MessageBuilder* message,
                           kj::ArrayPtr<MessageBuilder::SegmentInit> segments)
    : message(message),
      segment0(this, SegmentId(0), segments[0].space.begin(),
               verifySegmentSize(segments[0].space.size()),
               &this->dummyLimiter, verifySegmentSize(segments[0].wordsUsed)) {
  if (segments.size() > 1) {
    kj::Vector<kj::Own<SegmentBuilder>> builders(segments.size() - 1);

    uint i = 1;
    for (auto& segment: segments.slice(1, segments.size())) {
      builders.add(kj::heap<SegmentBuilder>(
          this, SegmentId(i++), segment.space.begin(), verifySegmentSize(segment.space.size()),
          &this->dummyLimiter, verifySegmentSize(segment.wordsUsed)));
    }

    kj::Vector<kj::ArrayPtr<const word>> forOutput;
    forOutput.resize(segments.size());

    segmentWithSpace = builders.back();

    this->moreSegments = kj::heap<MultiSegmentState>(
        MultiSegmentState { kj::mv(builders), kj::mv(forOutput) });

  } else {
    segmentWithSpace = &segment0;
  }
}